

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

Am_Object get_command_to_undo(Am_Object *cmd)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Slot_Key in_SI;
  Am_Value_List l;
  Am_Value value;
  Am_Value_List AStack_38;
  Am_Object local_28;
  Am_Value local_20;
  
  Am_Object::Get_Object(&local_28,in_SI,0x170);
  Am_Object::Get_Sibling((Am_Object *)&AStack_38,(Am_Slot_Key)&local_28,(ulong)Am_UNDO_SCROLL_GROUP)
  ;
  pAVar3 = Am_Object::Get((Am_Object *)&AStack_38,0x169,1);
  Am_Value::Am_Value(&local_20,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&AStack_38);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Value::Valid(&local_20);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&AStack_38,&local_20);
    uVar2 = Am_Value_List::Length(&AStack_38);
    if (uVar2 == 1) {
      Am_Value_List::Start(&AStack_38);
      pAVar3 = Am_Value_List::Get(&AStack_38);
      Am_Object::Am_Object(cmd,pAVar3);
      Am_Value_List::~Am_Value_List(&AStack_38);
      goto LAB_00215a54;
    }
    Am_Value_List::~Am_Value_List(&AStack_38);
  }
  Am_Object::Am_Object(cmd,&Am_No_Object);
LAB_00215a54:
  Am_Value::~Am_Value(&local_20);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
get_command_to_undo(Am_Object cmd)
{
  Am_Value value = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                       .Get_Sibling(Am_UNDO_SCROLL_GROUP)
                       .Peek(Am_VALUE);
  if (value.Valid()) {
    Am_Value_List l = value;
    if (l.Length() == 1) {
      l.Start();
      // because id is the cmd to undo, it will be the value of the menu
      Am_Object undo_cmd = l.Get();
      return (undo_cmd);
    }
  }
  return Am_No_Object;
}